

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O1

string * __thiscall
flatbuffers::BaseGenerator::GetNameSpace_abi_cxx11_
          (string *__return_storage_ptr__,BaseGenerator *this,Definition *def)

{
  Namespace *pNVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer pbVar4;
  
  pNVar1 = def->defined_namespace;
  iVar3 = (*this->_vptr_BaseGenerator[3])(this);
  if ((Namespace *)CONCAT44(extraout_var,iVar3) == pNVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->qualifying_start_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (this->qualifying_start_)._M_string_length);
    pbVar4 = (pNVar1->components).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (pbVar4 != (pNVar1->components).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pbVar4->_M_dataplus)._M_p);
      pbVar4 = pbVar4 + 1;
      if (pbVar4 != (pNVar1->components).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,
                   (ulong)(this->qualifying_separator_)._M_dataplus._M_p);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BaseGenerator::GetNameSpace(const Definition &def) const {
  const Namespace *ns = def.defined_namespace;
  if (CurrentNameSpace() == ns) return "";
  std::string qualified_name = qualifying_start_;
  for (auto it = ns->components.begin(); it != ns->components.end(); ++it) {
    qualified_name += *it;
    if ((it + 1) != ns->components.end()) {
      qualified_name += qualifying_separator_;
    }
  }

  return qualified_name;
}